

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O0

ServiceOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (ServiceOptions *__return_storage_ptr__,ServiceDescriptor *descriptor)

{
  ServiceDescriptor *descriptor_local;
  
  anon_unknown_0::StripLocalOptions<google::protobuf::ServiceDescriptor>
            (__return_storage_ptr__,descriptor);
  return __return_storage_ptr__;
}

Assistant:

ServiceOptions StripLocalSourceRetentionOptions(
    const ServiceDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}